

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptContext.cpp
# Opt level: O1

BOOL __thiscall Js::ScriptContext::CheckObject(ScriptContext *this,Var object)

{
  Type ppvVar1;
  long lVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  
  uVar3 = (ulong)(this->operationStack->list).
                 super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.count;
  bVar6 = 0 < (long)uVar3;
  if (0 < (long)uVar3) {
    ppvVar1 = (this->operationStack->list).
              super_ReadOnlyList<void_*,_Memory::ArenaAllocator,_DefaultComparer>.buffer;
    if (*ppvVar1 == object) {
      bVar6 = true;
    }
    else {
      uVar4 = 0;
      do {
        uVar5 = uVar3;
        if (uVar3 - 1 == uVar4) break;
        uVar5 = uVar4 + 1;
        lVar2 = uVar4 + 1;
        uVar4 = uVar5;
      } while (ppvVar1[lVar2] != object);
      bVar6 = uVar5 < uVar3;
    }
  }
  return (BOOL)bVar6;
}

Assistant:

BOOL ScriptContext::CheckObject(Var object)
    {
        return operationStack->Contains(object);
    }